

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void mi_heap_collect_ex(mi_heap_t *heap,mi_collect_t collect)

{
  mi_threadid_t mVar1;
  _Bool _Var2;
  mi_threadid_t mVar3;
  bool bVar4;
  undefined1 local_24 [4];
  
  if (heap == &_mi_heap_empty || heap == (mi_heap_t *)0x0) {
    return;
  }
  _mi_deferred_free(heap,collect != MI_NORMAL);
  bVar4 = true;
  _Var2 = _mi_is_main_thread();
  if (_Var2) {
    mVar1 = heap->thread_id;
    mVar3 = _mi_thread_id();
    bVar4 = mVar1 != mVar3;
    if (collect == MI_FORCE && !bVar4) {
      if ((heap->tld->heap_backing == heap) && (heap->no_reclaim == false)) {
        _mi_abandoned_reclaim_all(heap,&heap->tld->segments);
      }
      goto LAB_0047b892;
    }
  }
  if (collect == MI_ABANDON) {
    mi_heap_visit_pages(heap,mi_heap_page_never_delayed_free,(void *)0x0,(void *)0x0);
  }
LAB_0047b892:
  _mi_heap_delayed_free_all(heap);
  _mi_heap_collect_retired(heap,collect != MI_NORMAL);
  mi_heap_visit_pages(heap,mi_heap_page_collect,local_24,(void *)0x0);
  _mi_abandoned_collect(heap,collect == MI_FORCE,&heap->tld->segments);
  if ((!(bool)(collect == MI_NORMAL | bVar4)) && (heap->tld->heap_backing == heap)) {
    _mi_thread_data_collect();
  }
  _mi_arenas_collect(collect == MI_FORCE);
  if (collect < MI_ABANDON) {
    mi_stats_merge();
  }
  return;
}

Assistant:

static void mi_heap_collect_ex(mi_heap_t* heap, mi_collect_t collect)
{
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;

  const bool force = (collect >= MI_FORCE);
  _mi_deferred_free(heap, force);

  // python/cpython#112532: we may be called from a thread that is not the owner of the heap
  const bool is_main_thread = (_mi_is_main_thread() && heap->thread_id == _mi_thread_id());

  // note: never reclaim on collect but leave it to threads that need storage to reclaim
  const bool force_main =
    #ifdef NDEBUG
      collect == MI_FORCE
    #else
      collect >= MI_FORCE
    #endif
      && is_main_thread && mi_heap_is_backing(heap) && !heap->no_reclaim;

  if (force_main) {
    // the main thread is abandoned (end-of-program), try to reclaim all abandoned segments.
    // if all memory is freed by now, all segments should be freed.
    // note: this only collects in the current subprocess
    _mi_abandoned_reclaim_all(heap, &heap->tld->segments);
  }

  // if abandoning, mark all pages to no longer add to delayed_free
  if (collect == MI_ABANDON) {
    mi_heap_visit_pages(heap, &mi_heap_page_never_delayed_free, NULL, NULL);
  }

  // free all current thread delayed blocks.
  // (if abandoning, after this there are no more thread-delayed references into the pages.)
  _mi_heap_delayed_free_all(heap);

  // collect retired pages
  _mi_heap_collect_retired(heap, force);

  // collect all pages owned by this thread
  mi_heap_visit_pages(heap, &mi_heap_page_collect, &collect, NULL);
  mi_assert_internal( collect != MI_ABANDON || mi_atomic_load_ptr_acquire(mi_block_t,&heap->thread_delayed_free) == NULL );

  // collect abandoned segments (in particular, purge expired parts of segments in the abandoned segment list)
  // note: forced purge can be quite expensive if many threads are created/destroyed so we do not force on abandonment
  _mi_abandoned_collect(heap, collect == MI_FORCE /* force? */, &heap->tld->segments);

  // if forced, collect thread data cache on program-exit (or shared library unload)
  if (force && is_main_thread && mi_heap_is_backing(heap)) {
    _mi_thread_data_collect();  // collect thread data cache
  }

  // collect arenas (this is program wide so don't force purges on abandonment of threads)
  _mi_arenas_collect(collect == MI_FORCE /* force purge? */);

  // merge statistics
  if (collect <= MI_FORCE) {
    mi_stats_merge();
  }
}